

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLright2(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *vec,int *ridx,int *rn,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec2,int *ridx2,int *rn2,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps2)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  ulong uVar6;
  bool bVar7;
  int *piVar8;
  ulong uVar9;
  int *piVar10;
  int iVar11;
  ulong uVar12;
  cpp_dec_float<100U,_int,_void> *pcVar13;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_718;
  int *local_6c8;
  int *local_6c0;
  pointer local_6b8;
  ulong local_6b0;
  ulong local_6a8;
  int *local_6a0;
  int *local_698;
  int *local_690;
  int *local_688;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_680;
  cpp_dec_float<100U,_int,_void> local_678;
  cpp_dec_float<100U,_int,_void> local_628;
  cpp_dec_float<100U,_int,_void> local_5d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_588;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  cpp_dec_float<100U,_int,_void> local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_498;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  cpp_dec_float<100U,_int,_void> local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  local_678.fpclass = cpp_dec_float_finite;
  local_678.prec_elem = 0x10;
  local_678.data._M_elems[0] = 0;
  local_678.data._M_elems[1] = 0;
  local_678.data._M_elems[2] = 0;
  local_678.data._M_elems[3] = 0;
  local_678.data._M_elems[4] = 0;
  local_678.data._M_elems[5] = 0;
  local_678.data._M_elems[6] = 0;
  local_678.data._M_elems[7] = 0;
  local_678.data._M_elems[8] = 0;
  local_678.data._M_elems[9] = 0;
  local_678.data._M_elems[10] = 0;
  local_678.data._M_elems[0xb] = 0;
  local_678.data._M_elems[0xc] = 0;
  local_678.data._M_elems[0xd] = 0;
  local_678.data._M_elems._56_5_ = 0;
  local_678.data._M_elems[0xf]._1_3_ = 0;
  local_678.exp = 0;
  local_678.neg = false;
  local_718.fpclass = cpp_dec_float_finite;
  local_718.prec_elem = 0x10;
  local_718.data._M_elems[0] = 0;
  local_718.data._M_elems[1] = 0;
  local_718.data._M_elems[2] = 0;
  local_718.data._M_elems[3] = 0;
  local_718.data._M_elems[4] = 0;
  local_718.data._M_elems[5] = 0;
  local_718.data._M_elems[6] = 0;
  local_718.data._M_elems[7] = 0;
  local_718.data._M_elems[0xc] = 0;
  local_718.data._M_elems[0xd] = 0;
  local_718.data._M_elems._56_5_ = 0;
  local_718.data._M_elems[0xf]._1_3_ = 0;
  local_718.exp = 0;
  local_718.neg = false;
  local_718.data._M_elems[8] = 0;
  local_718.data._M_elems[9] = 0;
  local_718.data._M_elems[10] = 0;
  local_718.data._M_elems[0xb] = 0;
  local_6b8 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (this->l).firstUpdate;
  uVar12 = 0;
  local_6b0 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    local_6b0 = uVar12;
  }
  local_6c0 = (this->l).idx;
  local_688 = (this->l).row;
  local_6c8 = (this->l).start;
  local_6a0 = ridx;
  local_698 = rn;
  local_680 = eps;
  for (; uVar12 != local_6b0; uVar12 = uVar12 + 1) {
    iVar3 = local_688[uVar12];
    local_718.data._M_elems._0_8_ = *(undefined8 *)vec2[iVar3].m_backend.data._M_elems;
    local_718.data._M_elems._8_8_ = *(undefined8 *)(vec2[iVar3].m_backend.data._M_elems + 2);
    puVar1 = vec2[iVar3].m_backend.data._M_elems + 4;
    local_718.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_718.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec2[iVar3].m_backend.data._M_elems + 8;
    local_718.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_718.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec2[iVar3].m_backend.data._M_elems + 0xc;
    local_718.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    uVar5 = *(undefined8 *)(puVar1 + 2);
    local_718.data._M_elems._56_5_ = SUB85(uVar5,0);
    local_718.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_718.exp = vec2[iVar3].m_backend.exp;
    local_718.neg = vec2[iVar3].m_backend.neg;
    local_718.fpclass = vec2[iVar3].m_backend.fpclass;
    local_718.prec_elem = vec2[iVar3].m_backend.prec_elem;
    local_678.data._M_elems._0_8_ = *(undefined8 *)vec[iVar3].m_backend.data._M_elems;
    local_678.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 2);
    puVar1 = vec[iVar3].m_backend.data._M_elems + 4;
    local_678.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_678.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar3].m_backend.data._M_elems + 8;
    local_678.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_678.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar3].m_backend.data._M_elems + 0xc;
    local_678.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    uVar5 = *(undefined8 *)(puVar1 + 2);
    local_678.data._M_elems._56_5_ = SUB85(uVar5,0);
    local_678.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_678.exp = vec[iVar3].m_backend.exp;
    local_678.neg = vec[iVar3].m_backend.neg;
    local_538.m_backend.fpclass = vec[iVar3].m_backend.fpclass;
    local_538.m_backend.prec_elem = vec[iVar3].m_backend.prec_elem;
    local_678.prec_elem = local_538.m_backend.prec_elem;
    local_678.fpclass = local_538.m_backend.fpclass;
    local_538.m_backend.data._M_elems._0_8_ = *(undefined8 *)vec[iVar3].m_backend.data._M_elems;
    local_538.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 2);
    puVar1 = vec[iVar3].m_backend.data._M_elems + 4;
    local_538.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_538.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar3].m_backend.data._M_elems + 8;
    local_538.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_538.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar3].m_backend.data._M_elems + 0xc;
    local_538.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_538.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_680->m_backend).data._M_elems;
    local_1c8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((local_680->m_backend).data._M_elems + 2);
    local_1c8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((local_680->m_backend).data._M_elems + 4);
    local_1c8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((local_680->m_backend).data._M_elems + 6);
    local_1c8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((local_680->m_backend).data._M_elems + 8);
    local_1c8.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((local_680->m_backend).data._M_elems + 10);
    local_1c8.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((local_680->m_backend).data._M_elems + 0xc);
    local_1c8.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((local_680->m_backend).data._M_elems + 0xe);
    local_1c8.m_backend.exp = (local_680->m_backend).exp;
    local_1c8.m_backend.neg = (local_680->m_backend).neg;
    local_1c8.m_backend.fpclass = (local_680->m_backend).fpclass;
    local_1c8.m_backend.prec_elem = (local_680->m_backend).prec_elem;
    local_538.m_backend.exp = local_678.exp;
    local_538.m_backend.neg = local_678.neg;
    bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_538,&local_1c8);
    piVar10 = local_6c8;
    if (bVar7) {
      iVar3 = local_6c8[uVar12];
      uVar9 = (ulong)iVar3;
      piVar8 = local_6c0 + uVar9;
      pcVar13 = &local_6b8[uVar9].m_backend;
      local_218.m_backend.data._M_elems[0xf]._1_3_ = local_718.data._M_elems[0xf]._1_3_;
      local_218.m_backend.data._M_elems._56_5_ = local_718.data._M_elems._56_5_;
      local_218.m_backend.data._M_elems[0xc] = local_718.data._M_elems[0xc];
      local_218.m_backend.data._M_elems[0xd] = local_718.data._M_elems[0xd];
      local_218.m_backend.data._M_elems[8] = local_718.data._M_elems[8];
      local_218.m_backend.data._M_elems[9] = local_718.data._M_elems[9];
      local_218.m_backend.data._M_elems[10] = local_718.data._M_elems[10];
      local_218.m_backend.data._M_elems[0xb] = local_718.data._M_elems[0xb];
      local_218.m_backend.data._M_elems[4] = local_718.data._M_elems[4];
      local_218.m_backend.data._M_elems[5] = local_718.data._M_elems[5];
      local_218.m_backend.data._M_elems[6] = local_718.data._M_elems[6];
      local_218.m_backend.data._M_elems[7] = local_718.data._M_elems[7];
      local_218.m_backend.data._M_elems[0] = local_718.data._M_elems[0];
      local_218.m_backend.data._M_elems[1] = local_718.data._M_elems[1];
      local_218.m_backend.data._M_elems[2] = local_718.data._M_elems[2];
      local_218.m_backend.data._M_elems[3] = local_718.data._M_elems[3];
      local_218.m_backend.exp = local_718.exp;
      local_218.m_backend.neg = local_718.neg;
      local_218.m_backend.fpclass = local_718.fpclass;
      local_218.m_backend.prec_elem = local_718.prec_elem;
      local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
      local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2)
      ;
      local_268.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
      local_268.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
      local_268.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
      local_268.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
      local_268.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
      local_268.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
      local_268.m_backend.exp = (eps2->m_backend).exp;
      local_268.m_backend.neg = (eps2->m_backend).neg;
      local_268.m_backend.fpclass = (eps2->m_backend).fpclass;
      local_268.m_backend.prec_elem = (eps2->m_backend).prec_elem;
      bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_218,&local_268);
      iVar11 = piVar10[uVar12 + 1];
      uVar6 = uVar9;
      if (bVar7) {
        for (; local_6a8 = uVar6, (int)uVar9 < iVar11; iVar11 = iVar11 + -1) {
          iVar3 = *piVar8;
          local_690 = piVar8 + 1;
          local_88.fpclass = cpp_dec_float_finite;
          local_88.prec_elem = 0x10;
          local_88.data._M_elems[0] = 0;
          local_88.data._M_elems[1] = 0;
          local_88.data._M_elems[2] = 0;
          local_88.data._M_elems[3] = 0;
          local_88.data._M_elems[4] = 0;
          local_88.data._M_elems[5] = 0;
          local_88.data._M_elems[6] = 0;
          local_88.data._M_elems[7] = 0;
          local_88.data._M_elems[8] = 0;
          local_88.data._M_elems[9] = 0;
          local_88.data._M_elems[10] = 0;
          local_88.data._M_elems[0xb] = 0;
          local_88.data._M_elems[0xc] = 0;
          local_88.data._M_elems[0xd] = 0;
          local_88.data._M_elems._56_5_ = 0;
          local_88.data._M_elems[0xf]._1_3_ = 0;
          local_88.exp = 0;
          local_88.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_88,&local_678,pcVar13);
          updateSolutionVectorLright
                    (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_88,iVar3,vec + iVar3,local_6a0,local_698);
          local_d8.fpclass = cpp_dec_float_finite;
          local_d8.prec_elem = 0x10;
          local_d8.data._M_elems[0] = 0;
          local_d8.data._M_elems[1] = 0;
          local_d8.data._M_elems[2] = 0;
          local_d8.data._M_elems[3] = 0;
          local_d8.data._M_elems[4] = 0;
          local_d8.data._M_elems[5] = 0;
          local_d8.data._M_elems[6] = 0;
          local_d8.data._M_elems[7] = 0;
          local_d8.data._M_elems[8] = 0;
          local_d8.data._M_elems[9] = 0;
          local_d8.data._M_elems[10] = 0;
          local_d8.data._M_elems[0xb] = 0;
          local_d8.data._M_elems[0xc] = 0;
          local_d8.data._M_elems[0xd] = 0;
          local_d8.data._M_elems._56_5_ = 0;
          local_d8.data._M_elems[0xf]._1_3_ = 0;
          local_d8.exp = 0;
          local_d8.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_d8,&local_718,pcVar13);
          piVar8 = local_690;
          uVar9 = local_6a8;
          updateSolutionVectorLright
                    (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_d8,iVar3,vec2 + iVar3,ridx2,rn2);
          pcVar13 = pcVar13 + 1;
          uVar6 = local_6a8;
        }
      }
      else {
        for (; iVar3 < iVar11; iVar11 = iVar11 + -1) {
          iVar4 = *piVar8;
          piVar8 = piVar8 + 1;
          local_128.fpclass = cpp_dec_float_finite;
          local_128.prec_elem = 0x10;
          local_128.data._M_elems[0] = 0;
          local_128.data._M_elems[1] = 0;
          local_128.data._M_elems[2] = 0;
          local_128.data._M_elems[3] = 0;
          local_128.data._M_elems[4] = 0;
          local_128.data._M_elems[5] = 0;
          local_128.data._M_elems[6] = 0;
          local_128.data._M_elems[7] = 0;
          local_128.data._M_elems[8] = 0;
          local_128.data._M_elems[9] = 0;
          local_128.data._M_elems[10] = 0;
          local_128.data._M_elems[0xb] = 0;
          local_128.data._M_elems[0xc] = 0;
          local_128.data._M_elems[0xd] = 0;
          local_128.data._M_elems._56_5_ = 0;
          local_128.data._M_elems[0xf]._1_3_ = 0;
          local_128.exp = 0;
          local_128.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_128,&local_678,pcVar13);
          updateSolutionVectorLright
                    (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_128,iVar4,vec + iVar4,local_6a0,local_698);
          pcVar13 = pcVar13 + 1;
        }
      }
    }
    else {
      local_2b8.m_backend.data._M_elems[0xf]._1_3_ = local_718.data._M_elems[0xf]._1_3_;
      local_2b8.m_backend.data._M_elems._56_5_ = local_718.data._M_elems._56_5_;
      local_2b8.m_backend.data._M_elems[0xc] = local_718.data._M_elems[0xc];
      local_2b8.m_backend.data._M_elems[0xd] = local_718.data._M_elems[0xd];
      local_2b8.m_backend.data._M_elems[8] = local_718.data._M_elems[8];
      local_2b8.m_backend.data._M_elems[9] = local_718.data._M_elems[9];
      local_2b8.m_backend.data._M_elems[10] = local_718.data._M_elems[10];
      local_2b8.m_backend.data._M_elems[0xb] = local_718.data._M_elems[0xb];
      local_2b8.m_backend.data._M_elems[4] = local_718.data._M_elems[4];
      local_2b8.m_backend.data._M_elems[5] = local_718.data._M_elems[5];
      local_2b8.m_backend.data._M_elems[6] = local_718.data._M_elems[6];
      local_2b8.m_backend.data._M_elems[7] = local_718.data._M_elems[7];
      local_2b8.m_backend.data._M_elems[0] = local_718.data._M_elems[0];
      local_2b8.m_backend.data._M_elems[1] = local_718.data._M_elems[1];
      local_2b8.m_backend.data._M_elems[2] = local_718.data._M_elems[2];
      local_2b8.m_backend.data._M_elems[3] = local_718.data._M_elems[3];
      local_2b8.m_backend.exp = local_718.exp;
      local_2b8.m_backend.neg = local_718.neg;
      local_2b8.m_backend.fpclass = local_718.fpclass;
      local_2b8.m_backend.prec_elem = local_718.prec_elem;
      local_308.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
      local_308.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2)
      ;
      local_308.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
      local_308.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
      local_308.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
      local_308.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
      local_308.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
      local_308.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
      local_308.m_backend.exp = (eps2->m_backend).exp;
      local_308.m_backend.neg = (eps2->m_backend).neg;
      local_308.m_backend.fpclass = (eps2->m_backend).fpclass;
      local_308.m_backend.prec_elem = (eps2->m_backend).prec_elem;
      bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_2b8,&local_308);
      if (bVar7) {
        iVar3 = local_6c8[uVar12];
        piVar10 = local_6c0 + iVar3;
        pcVar13 = &local_6b8[iVar3].m_backend;
        for (iVar11 = local_6c8[uVar12 + 1]; iVar3 < iVar11; iVar11 = iVar11 + -1) {
          iVar4 = *piVar10;
          piVar10 = piVar10 + 1;
          local_178.fpclass = cpp_dec_float_finite;
          local_178.prec_elem = 0x10;
          local_178.data._M_elems[0] = 0;
          local_178.data._M_elems[1] = 0;
          local_178.data._M_elems[2] = 0;
          local_178.data._M_elems[3] = 0;
          local_178.data._M_elems[4] = 0;
          local_178.data._M_elems[5] = 0;
          local_178.data._M_elems[6] = 0;
          local_178.data._M_elems[7] = 0;
          local_178.data._M_elems[8] = 0;
          local_178.data._M_elems[9] = 0;
          local_178.data._M_elems[10] = 0;
          local_178.data._M_elems[0xb] = 0;
          local_178.data._M_elems[0xc] = 0;
          local_178.data._M_elems[0xd] = 0;
          local_178.data._M_elems._56_5_ = 0;
          local_178.data._M_elems[0xf]._1_3_ = 0;
          local_178.exp = 0;
          local_178.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_178,&local_718,pcVar13);
          updateSolutionVectorLright
                    (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_178,iVar4,vec2 + iVar4,ridx2,rn2);
          pcVar13 = pcVar13 + 1;
        }
      }
    }
  }
  if ((this->l).updateType != 0) {
    iVar3 = (this->l).firstUnused;
    uVar12 = local_6b0;
    while (piVar10 = local_6c8, (long)uVar12 < (long)iVar3) {
      local_690 = (int *)(long)local_6c8[uVar12];
      piVar8 = local_6c0 + (long)local_690;
      pcVar13 = &local_6b8[(long)local_690].m_backend;
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_628);
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_4e8);
      local_6a8 = uVar12 + 1;
      local_6b0 = uVar12;
      for (iVar11 = piVar10[uVar12 + 1]; (int)local_690 < iVar11; iVar11 = iVar11 + -1) {
        local_5d8.fpclass = cpp_dec_float_finite;
        local_5d8.prec_elem = 0x10;
        local_5d8.data._M_elems[0] = 0;
        local_5d8.data._M_elems[1] = 0;
        local_5d8.data._M_elems[2] = 0;
        local_5d8.data._M_elems[3] = 0;
        local_5d8.data._M_elems[4] = 0;
        local_5d8.data._M_elems[5] = 0;
        local_5d8.data._M_elems[6] = 0;
        local_5d8.data._M_elems[7] = 0;
        local_5d8.data._M_elems[8] = 0;
        local_5d8.data._M_elems[9] = 0;
        local_5d8.data._M_elems[10] = 0;
        local_5d8.data._M_elems[0xb] = 0;
        local_5d8.data._M_elems[0xc] = 0;
        local_5d8.data._M_elems[0xd] = 0;
        local_5d8.data._M_elems._56_5_ = 0;
        local_5d8.data._M_elems[0xf]._1_3_ = 0;
        local_5d8.exp = 0;
        local_5d8.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_5d8,&vec[*piVar8].m_backend,pcVar13);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&local_628,&local_5d8);
        iVar4 = *piVar8;
        piVar8 = piVar8 + 1;
        local_5d8.fpclass = cpp_dec_float_finite;
        local_5d8.prec_elem = 0x10;
        local_5d8.data._M_elems[0] = 0;
        local_5d8.data._M_elems[1] = 0;
        local_5d8.data._M_elems[2] = 0;
        local_5d8.data._M_elems[3] = 0;
        local_5d8.data._M_elems[4] = 0;
        local_5d8.data._M_elems[5] = 0;
        local_5d8.data._M_elems[6] = 0;
        local_5d8.data._M_elems[7] = 0;
        local_5d8.data._M_elems[8] = 0;
        local_5d8.data._M_elems[9] = 0;
        local_5d8.data._M_elems[10] = 0;
        local_5d8.data._M_elems[0xb] = 0;
        local_5d8.data._M_elems[0xc] = 0;
        local_5d8.data._M_elems[0xd] = 0;
        local_5d8.data._M_elems._56_5_ = 0;
        local_5d8.data._M_elems[0xf]._1_3_ = 0;
        local_5d8.exp = 0;
        local_5d8.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_5d8,&vec2[iVar4].m_backend,pcVar13);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&local_4e8,&local_5d8);
        pcVar13 = pcVar13 + 1;
      }
      local_678.data._M_elems[0xc] = local_628.data._M_elems[0xc];
      local_678.data._M_elems[0xd] = local_628.data._M_elems[0xd];
      local_678.data._M_elems._56_5_ = local_628.data._M_elems._56_5_;
      local_678.data._M_elems[0xf]._1_3_ = local_628.data._M_elems[0xf]._1_3_;
      local_678.data._M_elems[8] = local_628.data._M_elems[8];
      local_678.data._M_elems[9] = local_628.data._M_elems[9];
      local_678.data._M_elems[10] = local_628.data._M_elems[10];
      local_678.data._M_elems[0xb] = local_628.data._M_elems[0xb];
      local_678.data._M_elems[4] = local_628.data._M_elems[4];
      local_678.data._M_elems[5] = local_628.data._M_elems[5];
      local_678.data._M_elems[6] = local_628.data._M_elems[6];
      local_678.data._M_elems[7] = local_628.data._M_elems[7];
      local_678.data._M_elems[0] = local_628.data._M_elems[0];
      local_678.data._M_elems[1] = local_628.data._M_elems[1];
      local_678.data._M_elems[2] = local_628.data._M_elems[2];
      local_678.data._M_elems[3] = local_628.data._M_elems[3];
      local_678.exp = local_628.exp;
      local_678.neg = local_628.neg;
      local_678.prec_elem = local_628.prec_elem;
      local_678.fpclass = local_628.fpclass;
      local_718.data._M_elems[0] = local_4e8.data._M_elems[0];
      local_718.data._M_elems[1] = local_4e8.data._M_elems[1];
      local_718.data._M_elems[2] = local_4e8.data._M_elems[2];
      local_718.data._M_elems[3] = local_4e8.data._M_elems[3];
      local_718.data._M_elems[4] = local_4e8.data._M_elems[4];
      local_718.data._M_elems[5] = local_4e8.data._M_elems[5];
      local_718.data._M_elems[6] = local_4e8.data._M_elems[6];
      local_718.data._M_elems[7] = local_4e8.data._M_elems[7];
      local_718.data._M_elems[8] = local_4e8.data._M_elems[8];
      local_718.data._M_elems[9] = local_4e8.data._M_elems[9];
      local_718.data._M_elems[10] = local_4e8.data._M_elems[10];
      local_718.data._M_elems[0xb] = local_4e8.data._M_elems[0xb];
      local_718.data._M_elems[0xc] = local_4e8.data._M_elems[0xc];
      local_718.data._M_elems[0xd] = local_4e8.data._M_elems[0xd];
      local_718.data._M_elems._56_5_ = local_4e8.data._M_elems._56_5_;
      local_718.data._M_elems[0xf]._1_3_ = local_4e8.data._M_elems[0xf]._1_3_;
      local_718.exp = local_4e8.exp;
      local_718.neg = local_4e8.neg;
      local_718.fpclass = local_4e8.fpclass;
      local_718.prec_elem = local_4e8.prec_elem;
      iVar11 = local_688[local_6b0];
      local_588.m_backend.data._M_elems[0xc] = local_628.data._M_elems[0xc];
      local_588.m_backend.data._M_elems[0xd] = local_628.data._M_elems[0xd];
      local_588.m_backend.data._M_elems[0xe] = local_628.data._M_elems[0xe];
      local_588.m_backend.data._M_elems[0xf] = local_628.data._M_elems[0xf];
      local_588.m_backend.data._M_elems[8] = local_628.data._M_elems[8];
      local_588.m_backend.data._M_elems[9] = local_628.data._M_elems[9];
      local_588.m_backend.data._M_elems[10] = local_628.data._M_elems[10];
      local_588.m_backend.data._M_elems[0xb] = local_628.data._M_elems[0xb];
      local_588.m_backend.data._M_elems[4] = local_628.data._M_elems[4];
      local_588.m_backend.data._M_elems[5] = local_628.data._M_elems[5];
      local_588.m_backend.data._M_elems[6] = local_628.data._M_elems[6];
      local_588.m_backend.data._M_elems[7] = local_628.data._M_elems[7];
      local_588.m_backend.data._M_elems[0] = local_628.data._M_elems[0];
      local_588.m_backend.data._M_elems[1] = local_628.data._M_elems[1];
      local_588.m_backend.data._M_elems[2] = local_628.data._M_elems[2];
      local_588.m_backend.data._M_elems[3] = local_628.data._M_elems[3];
      local_588.m_backend.exp = local_628.exp;
      local_588.m_backend.neg = local_628.neg;
      local_588.m_backend.fpclass = local_628.fpclass;
      local_588.m_backend.prec_elem = local_628.prec_elem;
      local_358.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_680->m_backend).data._M_elems;
      local_358.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_680->m_backend).data._M_elems + 2);
      local_358.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_680->m_backend).data._M_elems + 4);
      local_358.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_680->m_backend).data._M_elems + 6);
      local_358.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_680->m_backend).data._M_elems + 8);
      local_358.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((local_680->m_backend).data._M_elems + 10);
      local_358.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((local_680->m_backend).data._M_elems + 0xc);
      local_358.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((local_680->m_backend).data._M_elems + 0xe);
      local_358.m_backend.exp = (local_680->m_backend).exp;
      local_358.m_backend.neg = (local_680->m_backend).neg;
      local_358.m_backend.fpclass = (local_680->m_backend).fpclass;
      local_358.m_backend.prec_elem = (local_680->m_backend).prec_elem;
      bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_588,&local_358);
      if (bVar7) {
        local_3a8.m_backend.data._M_elems[0xf]._1_3_ = local_678.data._M_elems[0xf]._1_3_;
        local_3a8.m_backend.data._M_elems._56_5_ = local_678.data._M_elems._56_5_;
        local_3a8.m_backend.data._M_elems[0xc] = local_678.data._M_elems[0xc];
        local_3a8.m_backend.data._M_elems[0xd] = local_678.data._M_elems[0xd];
        local_3a8.m_backend.data._M_elems[8] = local_678.data._M_elems[8];
        local_3a8.m_backend.data._M_elems[9] = local_678.data._M_elems[9];
        local_3a8.m_backend.data._M_elems[10] = local_678.data._M_elems[10];
        local_3a8.m_backend.data._M_elems[0xb] = local_678.data._M_elems[0xb];
        local_3a8.m_backend.data._M_elems[4] = local_678.data._M_elems[4];
        local_3a8.m_backend.data._M_elems[5] = local_678.data._M_elems[5];
        local_3a8.m_backend.data._M_elems[6] = local_678.data._M_elems[6];
        local_3a8.m_backend.data._M_elems[7] = local_678.data._M_elems[7];
        local_3a8.m_backend.data._M_elems[0] = local_678.data._M_elems[0];
        local_3a8.m_backend.data._M_elems[1] = local_678.data._M_elems[1];
        local_3a8.m_backend.data._M_elems[2] = local_678.data._M_elems[2];
        local_3a8.m_backend.data._M_elems[3] = local_678.data._M_elems[3];
        local_3a8.m_backend.exp = local_678.exp;
        local_3a8.m_backend.neg = local_678.neg;
        local_3a8.m_backend.fpclass = local_678.fpclass;
        local_3a8.m_backend.prec_elem = local_678.prec_elem;
        updateSolutionVectorLright(this,&local_3a8,iVar11,vec + iVar11,local_6a0,local_698);
      }
      local_3f8.m_backend.data._M_elems[0xf]._1_3_ = local_718.data._M_elems[0xf]._1_3_;
      local_3f8.m_backend.data._M_elems._56_5_ = local_718.data._M_elems._56_5_;
      local_3f8.m_backend.data._M_elems[0xc] = local_718.data._M_elems[0xc];
      local_3f8.m_backend.data._M_elems[0xd] = local_718.data._M_elems[0xd];
      local_3f8.m_backend.data._M_elems[8] = local_718.data._M_elems[8];
      local_3f8.m_backend.data._M_elems[9] = local_718.data._M_elems[9];
      local_3f8.m_backend.data._M_elems[10] = local_718.data._M_elems[10];
      local_3f8.m_backend.data._M_elems[0xb] = local_718.data._M_elems[0xb];
      local_3f8.m_backend.data._M_elems[4] = local_718.data._M_elems[4];
      local_3f8.m_backend.data._M_elems[5] = local_718.data._M_elems[5];
      local_3f8.m_backend.data._M_elems[6] = local_718.data._M_elems[6];
      local_3f8.m_backend.data._M_elems[7] = local_718.data._M_elems[7];
      local_3f8.m_backend.data._M_elems[0] = local_718.data._M_elems[0];
      local_3f8.m_backend.data._M_elems[1] = local_718.data._M_elems[1];
      local_3f8.m_backend.data._M_elems[2] = local_718.data._M_elems[2];
      local_3f8.m_backend.data._M_elems[3] = local_718.data._M_elems[3];
      local_3f8.m_backend.exp = local_718.exp;
      local_3f8.m_backend.neg = local_718.neg;
      local_3f8.m_backend.fpclass = local_718.fpclass;
      local_3f8.m_backend.prec_elem = local_718.prec_elem;
      local_448.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
      local_448.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2)
      ;
      local_448.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
      local_448.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
      local_448.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
      local_448.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
      local_448.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
      local_448.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
      local_448.m_backend.exp = (eps2->m_backend).exp;
      local_448.m_backend.neg = (eps2->m_backend).neg;
      local_448.m_backend.fpclass = (eps2->m_backend).fpclass;
      local_448.m_backend.prec_elem = (eps2->m_backend).prec_elem;
      bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_3f8,&local_448);
      uVar12 = local_6a8;
      if (bVar7) {
        local_498.m_backend.data._M_elems[0xf]._1_3_ = local_718.data._M_elems[0xf]._1_3_;
        local_498.m_backend.data._M_elems._56_5_ = local_718.data._M_elems._56_5_;
        local_498.m_backend.data._M_elems[0xc] = local_718.data._M_elems[0xc];
        local_498.m_backend.data._M_elems[0xd] = local_718.data._M_elems[0xd];
        local_498.m_backend.data._M_elems[8] = local_718.data._M_elems[8];
        local_498.m_backend.data._M_elems[9] = local_718.data._M_elems[9];
        local_498.m_backend.data._M_elems[10] = local_718.data._M_elems[10];
        local_498.m_backend.data._M_elems[0xb] = local_718.data._M_elems[0xb];
        local_498.m_backend.data._M_elems[4] = local_718.data._M_elems[4];
        local_498.m_backend.data._M_elems[5] = local_718.data._M_elems[5];
        local_498.m_backend.data._M_elems[6] = local_718.data._M_elems[6];
        local_498.m_backend.data._M_elems[7] = local_718.data._M_elems[7];
        local_498.m_backend.data._M_elems[0] = local_718.data._M_elems[0];
        local_498.m_backend.data._M_elems[1] = local_718.data._M_elems[1];
        local_498.m_backend.data._M_elems[2] = local_718.data._M_elems[2];
        local_498.m_backend.data._M_elems[3] = local_718.data._M_elems[3];
        local_498.m_backend.exp = local_718.exp;
        local_498.m_backend.neg = local_718.neg;
        local_498.m_backend.fpclass = local_718.fpclass;
        local_498.m_backend.prec_elem = local_718.prec_elem;
        updateSolutionVectorLright(this,&local_498,iVar11,vec2 + iVar11,ridx2,rn2);
        uVar12 = local_6a8;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright2(
   R* vec, int* ridx, int& rn, R eps,
   R* vec2, int* ridx2, int& rn2, R eps2)
{
   int i, j, k, n;
   int end;
   R x, x2;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   // loop through columns of L
   for(i = 0; i < end; ++i)
   {
      j = lrow[i];
      x2 = vec2[j];
      x = vec[j];

      // check whether there is a corresponding value in the first rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         // check whether there is  also a corresponding value in the second rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
         if(isNotZero(x2, eps2))
         {
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               ++val;
            }
         }
         // only the first VectorBase<R> needs to be modified
         else
         {
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               ++val;
            }
         }
      }
      // only the second VectorBase<R> needs to be modified
      else if(isNotZero(x2, eps2))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
            ++val;
         }
      }
   }

   if(l.updateType)                     /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp1, tmp2;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp1 += vec[*idx] * (*val);
            tmp2 += vec2[*idx++] * (*val++);
         }

         x = R(tmp1);
         x2 = R(tmp2);

         j = lrow[i];

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);

         if(isNotZero(x2, eps2))
            updateSolutionVectorLright(x2, j, vec2[j], ridx2, rn2);
      }
   }
}